

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_api.hpp
# Opt level: O1

hrgls_Status __thiscall
hrgls::API::SetLogMessageCallback(API *this,LogMessageCallback callback,void *userData)

{
  API_private *pAVar1;
  int iVar2;
  mapped_type mVar3;
  mapped_type *pmVar4;
  undefined8 uVar5;
  mutex *__mutex;
  hrgls_Status hVar6;
  key_type local_30;
  
  if (this->m_private == (API_private *)0x0) {
    hVar6 = 0x3ee;
  }
  else {
    __mutex = &this->m_private->m_cppMutex;
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar2 != 0) {
      uVar5 = std::__throw_system_error(iVar2);
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      _Unwind_Resume(uVar5);
    }
    pAVar1 = this->m_private;
    pAVar1->m_cppHandler = callback;
    pAVar1->m_cppUserData = userData;
    if (callback == (LogMessageCallback)0x0) {
      mVar3 = hrgls_APISetLogMessageCallback(pAVar1->m_api,0,0);
      pAVar1 = this->m_private;
      local_30._M_thread = pthread_self();
      pmVar4 = std::
               map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
               ::operator[](&pAVar1->m_status,&local_30);
    }
    else {
      mVar3 = hrgls_APISetLogMessageCallback(pAVar1->m_api,LogMessageCallbackHandler);
      pAVar1 = this->m_private;
      local_30._M_thread = pthread_self();
      pmVar4 = std::
               map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
               ::operator[](&pAVar1->m_status,&local_30);
    }
    *pmVar4 = mVar3;
    pAVar1 = this->m_private;
    local_30._M_thread = pthread_self();
    pmVar4 = std::
             map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
             ::operator[](&pAVar1->m_status,&local_30);
    hVar6 = *pmVar4;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  return hVar6;
}

Assistant:

hrgls_Status API::SetLogMessageCallback(LogMessageCallback callback,
    void *userData)
  {
    if (!m_private) {
      return hrgls_STATUS_NULL_OBJECT_POINTER;
    }

    // Lock the mutex while we're changing the handler data so we don't
    // change it out from under an active callback handler.
    std::lock_guard<std::mutex> lock(m_private->m_cppMutex);

    m_private->m_cppHandler = callback;
    m_private->m_cppUserData = userData;

    // If we are supposed to be calling a callback handler, then set our callback handler
    // as the intercept.  If not, then set it to nullptr so that no callbacks are called.
    if (callback) {
      m_private->m_status[std::this_thread::get_id()] = hrgls_APISetLogMessageCallback(m_private->m_api,
        LogMessageCallbackHandler, m_private);
    } else {
      m_private->m_status[std::this_thread::get_id()] = hrgls_APISetLogMessageCallback(m_private->m_api,
        nullptr, nullptr);
    }
    return m_private->m_status[std::this_thread::get_id()];
  }